

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatcoe.c
# Opt level: O2

void ecx_SDOinfoerror(ecx_contextt *context,uint16 Slave,uint16 Index,uint8 SubIdx,int32 AbortCode)

{
  ec_errort Ec;
  ec_errort local_1c;
  
  *context->ecaterror = '\x01';
  local_1c.Etype = EC_ERR_TYPE_SDOINFO_ERROR;
  local_1c.Slave = Slave;
  local_1c.Index = Index;
  local_1c.SubIdx = SubIdx;
  local_1c.field_6.AbortCode = AbortCode;
  ecx_pusherror(context,&local_1c);
  return;
}

Assistant:

static void ecx_SDOinfoerror(ecx_contextt *context, uint16 Slave, uint16 Index, uint8 SubIdx, int32 AbortCode)
{
   ec_errort Ec;

   Ec.Slave = Slave;
   Ec.Index = Index;
   Ec.SubIdx = SubIdx;
   *(context->ecaterror) = TRUE;
   Ec.Etype = EC_ERR_TYPE_SDOINFO_ERROR;
   Ec.AbortCode = AbortCode;
   ecx_pusherror(context, &Ec);
}